

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::contextMenuEvent(QAbstractSpinBox *this,QContextMenuEvent *event)

{
  bool bVar1;
  Reason RVar2;
  int iVar3;
  QWidget *this_00;
  QObject *pQVar4;
  QMenu *this_01;
  QAction *action_00;
  QPoint *p;
  QWidget *this_02;
  QWidget *pQVar5;
  QPoint *pQVar6;
  QWidget *pQVar7;
  QMenu *pQVar8;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  QContextMenuEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAction *action;
  QAction *down;
  QAction *up;
  uint se;
  QAction *selAll;
  QAbstractSpinBoxPrivate *d;
  QPoint pos;
  QPointer<QAbstractSpinBox> that;
  QPointer<QMenu> menu;
  QLineEdit *in_stack_00000270;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  QAbstractSpinBoxPrivate *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  QWidget *pQVar9;
  QAction *in_stack_fffffffffffffef8;
  QAction *in_stack_ffffffffffffff20;
  QAction *in_stack_ffffffffffffff28;
  QPoint local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined4 local_3c;
  QKeySequence local_38 [8];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QAbstractSpinBox *)0x68991e);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::createStandardContextMenu(in_stack_00000270);
  QPointer<QMenu>::QPointer<void>
            ((QPointer<QMenu> *)in_stack_fffffffffffffec0,
             (QMenu *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x689975);
  if (bVar1) {
    QAbstractSpinBoxPrivate::reset(in_stack_fffffffffffffec0);
    this_00 = (QWidget *)operator_new(0x10);
    tr((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
       (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    pQVar4 = (QObject *)::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x6899cf);
    QAction::QAction((QAction *)this_00,(QString *)local_30,pQVar4);
    QString::~QString((QString *)0x6899f1);
    pQVar7 = this_00;
    pQVar9 = this_00;
    QKeySequence::QKeySequence(local_38,SelectAll);
    QAction::setShortcut((QKeySequence *)pQVar9);
    QKeySequence::~QKeySequence(local_38);
    this_01 = QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689a49);
    QLineEdit::d_func((QLineEdit *)0x689a62);
    ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x689a71);
    QWidget::insertAction(pQVar9,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    action_00 = (QAction *)QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689a93);
    QLineEdit::d_func((QLineEdit *)0x689aac);
    ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x689abb);
    QWidget::removeAction
              ((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               in_stack_fffffffffffffef8);
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689ad5);
    QMenu::addSeparator((QMenu *)pQVar7);
    local_3c = (**(code **)(*in_RDI + 0x1c8))();
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
    p = (QPoint *)QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689b10);
    tr((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
       (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    this_02 = (QWidget *)
              QWidget::addAction(pQVar7,(QString *)
                                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ));
    QString::~QString((QString *)0x689b56);
    pQVar9 = this_02;
    QAction::setEnabled(SUB81(this_02,0));
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689b8a);
    __addr_len = (socklen_t *)0xffffffff;
    tr((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
       (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    pQVar5 = (QWidget *)
             QWidget::addAction(pQVar7,(QString *)
                                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                               );
    QString::~QString((QString *)0x689bd0);
    QAction::setEnabled(SUB81(pQVar5,0));
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689c04);
    QMenu::addSeparator((QMenu *)pQVar7);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractSpinBox>::QPointer<void>
              ((QPointer<QAbstractSpinBox> *)in_stack_fffffffffffffec0,
               (QAbstractSpinBox *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    RVar2 = QContextMenuEvent::reason(in_RSI);
    if (RVar2 == Mouse) {
      pQVar6 = QContextMenuEvent::globalPos(in_RSI);
      local_88 = *pQVar6;
    }
    else {
      QContextMenuEvent::pos(in_RSI);
      QPoint::x((QPoint *)0x689c8f);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8);
      QWidget::mapToGlobal
                (pQVar7,(QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      iVar3 = QWidget::width((QWidget *)0x689cc4);
      iVar3 = iVar3 / 2;
      QWidget::height((QWidget *)0x689cda);
      __addr_len = (socklen_t *)0x2;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                     in_stack_fffffffffffffeb8);
      local_88 = ::operator+((QPoint *)pQVar7,(QPoint *)CONCAT44(iVar3,in_stack_fffffffffffffec8));
    }
    QPointer<QMenu>::operator->((QPointer<QMenu> *)0x689d1f);
    iVar3 = (int)&local_88;
    pQVar7 = (QWidget *)QMenu::exec((QMenu *)this_02,p,action_00);
    pQVar8 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x689d45);
    if (pQVar8 != (QMenu *)0x0) {
      (**(code **)(*(long *)&pQVar8->super_QWidget + 0x20))();
    }
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractSpinBox> *)0x689d68);
    __addr = extraout_RDX;
    if ((bVar1) && (pQVar7 != (QWidget *)0x0)) {
      if (pQVar7 == pQVar9) {
        iVar3 = 1;
        (**(code **)(*in_RDI + 0x1b0))();
        __addr = extraout_RDX_00;
      }
      else if (pQVar7 == pQVar5) {
        iVar3 = -1;
        (**(code **)(*in_RDI + 0x1b0))();
        __addr = extraout_RDX_01;
      }
      else if (pQVar7 == this_00) {
        selectAll((QAbstractSpinBox *)this_01);
        __addr = extraout_RDX_02;
      }
    }
    QEvent::accept((QEvent *)in_RSI,iVar3,__addr,__addr_len);
    QPointer<QAbstractSpinBox>::~QPointer((QPointer<QAbstractSpinBox> *)0x689df1);
  }
  QPointer<QMenu>::~QPointer((QPointer<QMenu> *)0x689e09);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::contextMenuEvent(QContextMenuEvent *event)
{
#ifdef Q_OS_WASM
    if (!qstdweb::haveAsyncify()) {
        qDebug() << " Skipping context menu for spinbox since asyncify is off";
        return;
    }
#endif
    Q_D(QAbstractSpinBox);

    QPointer<QMenu> menu = d->edit->createStandardContextMenu();
    if (!menu)
        return;

    d->reset();

    QAction *selAll = new QAction(tr("&Select All"), menu);
#if QT_CONFIG(shortcut)
    selAll->setShortcut(QKeySequence::SelectAll);
#endif
    menu->insertAction(d->edit->d_func()->selectAllAction,
                      selAll);
    menu->removeAction(d->edit->d_func()->selectAllAction);
    menu->addSeparator();
    const uint se = stepEnabled();
    QAction *up = menu->addAction(tr("&Step up"));
    up->setEnabled(se & StepUpEnabled);
    QAction *down = menu->addAction(tr("Step &down"));
    down->setEnabled(se & StepDownEnabled);
    menu->addSeparator();

    const QPointer<QAbstractSpinBox> that = this;
    const QPoint pos = (event->reason() == QContextMenuEvent::Mouse)
        ? event->globalPos() : mapToGlobal(QPoint(event->pos().x(), 0)) + QPoint(width() / 2, height() / 2);
    const QAction *action = menu->exec(pos);
    delete static_cast<QMenu *>(menu);
    if (that && action) {
        if (action == up) {
            stepBy(1);
        } else if (action == down) {
            stepBy(-1);
        } else if (action == selAll) {
            selectAll();
        }
    }
    event->accept();
}